

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O1

TermList ApplicativeHelper::createAppTerm
                   (TermList s1,TermList s2,TermList arg1,TermList arg2,bool shared)

{
  uint function;
  TermList TVar1;
  
  if (createAppTerm(Kernel::TermList,Kernel::TermList,Kernel::TermList,Kernel::TermList,bool)::args
      == '\0') {
    createAppTerm();
  }
  createAppTerm::args._cursor = createAppTerm::args._stack;
  if (createAppTerm::args._stack == createAppTerm::args._end) {
    ::Lib::Stack<Kernel::TermList>::expand(&createAppTerm::args);
  }
  (createAppTerm::args._cursor)->_content = (uint64_t)s1;
  createAppTerm::args._cursor = createAppTerm::args._cursor + 1;
  if (createAppTerm::args._cursor == createAppTerm::args._end) {
    ::Lib::Stack<Kernel::TermList>::expand(&createAppTerm::args);
  }
  (createAppTerm::args._cursor)->_content = (uint64_t)s2;
  createAppTerm::args._cursor = createAppTerm::args._cursor + 1;
  if (createAppTerm::args._cursor == createAppTerm::args._end) {
    ::Lib::Stack<Kernel::TermList>::expand(&createAppTerm::args);
  }
  (createAppTerm::args._cursor)->_content = (uint64_t)arg1;
  createAppTerm::args._cursor = createAppTerm::args._cursor + 1;
  if (createAppTerm::args._cursor == createAppTerm::args._end) {
    ::Lib::Stack<Kernel::TermList>::expand(&createAppTerm::args);
  }
  (createAppTerm::args._cursor)->_content = (uint64_t)arg2;
  createAppTerm::args._cursor = createAppTerm::args._cursor + 1;
  function = Kernel::Signature::getApp(DAT_00b7e1b0);
  if (shared) {
    TVar1._content = (uint64_t)Kernel::Term::create(function,4,createAppTerm::args._stack);
  }
  else {
    TVar1._content = (uint64_t)Kernel::Term::createNonShared(function,4,createAppTerm::args._stack);
  }
  return (TermList)TVar1._content;
}

Assistant:

TermList ApplicativeHelper::createAppTerm(TermList s1, TermList s2, TermList arg1, TermList arg2, bool shared)
{
  static TermStack args;
  args.reset();
  args.push(s1);
  args.push(s2);
  args.push(arg1);
  args.push(arg2);
  unsigned app = env.signature->getApp();
  if(shared){
    return TermList(Term::create(app, 4, args.begin()));
  }
  return TermList(Term::createNonShared(app, 4, args.begin()));    
}